

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               MessageFactory *factory,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MapFieldBase *this;
  RepeatedPtrField<google::protobuf::Message> *pRVar4;
  undefined4 extraout_var;
  Descriptor *pDVar5;
  int i;
  long lVar6;
  MapIterator iter;
  Message *map_entry_message;
  MapIterator local_90;
  MapIterator local_60;
  
  this = Reflection::GetMapData(reflection,message,field);
  bVar1 = MapFieldBase::IsRepeatedFieldValid(this);
  if (bVar1) {
    pRVar4 = Reflection::GetRepeatedPtrField<google::protobuf::Message>(reflection,message,field);
    for (lVar6 = 0; lVar6 < (pRVar4->super_RepeatedPtrFieldBase).current_size_; lVar6 = lVar6 + 1) {
      local_90.iter_ = ((pRVar4->super_RepeatedPtrFieldBase).rep_)->elements[lVar6];
      std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
      ::emplace_back<google::protobuf::Message_const*>
                ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                  *)sorted_map_field,(Message **)&local_90);
    }
  }
  else {
    pDVar5 = FieldDescriptor::message_type(field);
    iVar2 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
    Reflection::MapBegin(&local_90,reflection,message,field);
    while( true ) {
      Reflection::MapEnd(&local_60,reflection,message,field);
      iVar3 = (*(local_90.map_)->_vptr_MapFieldBase[5])(local_90.map_,&local_90,&local_60);
      MapIterator::~MapIterator(&local_60);
      if ((char)iVar3 != '\0') break;
      local_60.iter_ =
           (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
                             ((long *)CONCAT44(extraout_var,iVar2));
      CopyKey(&local_90.key_,(Message *)local_60.iter_,*(FieldDescriptor **)(pDVar5 + 0x28));
      CopyValue(&local_90.value_,(Message *)local_60.iter_,
                (FieldDescriptor *)(*(long *)(pDVar5 + 0x28) + 0x98));
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::push_back(sorted_map_field,(value_type *)&local_60);
      (*(local_90.map_)->_vptr_MapFieldBase[0x12])(local_90.map_,&local_90);
    }
    MapIterator::~MapIterator(&local_90);
  }
  pDVar5 = FieldDescriptor::message_type(field);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
            ((__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )(sorted_map_field->
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )(sorted_map_field->
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
             (MapEntryMessageComparator)*(MapEntryMessageComparator *)(pDVar5 + 0x28));
  return !bVar1;
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, MessageFactory* factory,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrField<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO(teboring): For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype = factory->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}